

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::Add(Registry *this,BorderAgent *aValue)

{
  undefined4 uVar1;
  undefined1 auVar2 [8];
  char cVar3;
  char cVar4;
  int iVar5;
  undefined1 *puVar6;
  char *pcVar7;
  Status SVar8;
  bool bVar9;
  Domain dom;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  Network nwk;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  DomainId domainId;
  undefined1 local_3f0 [8];
  _Alloc_hider local_3e8;
  char local_3d8 [16];
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  local_3c8;
  undefined1 local_3a8 [8];
  _Alloc_hider local_3a0;
  size_t local_398;
  char local_390 [16];
  undefined6 local_380;
  undefined2 uStack_37a;
  undefined6 uStack_378;
  _Alloc_hider local_370;
  char local_360 [16];
  uint local_350;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  BorderAgent local_338;
  undefined1 local_1b8 [160];
  uint64_t local_118;
  uint32_t local_38;
  
  Domain::Domain((Domain *)local_3f0);
  if ((aValue->mPresentFlags & 0x1000) != 0) {
    std::__cxx11::string::_M_assign((string *)&local_3e8);
    local_348 = (undefined1  [8])0x0;
    uStack_340 = (pointer)0x0;
    local_338._vptr_BorderAgent = (_func_int **)0x0;
    iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,local_3f0);
    SVar8 = kError;
    if (((byte)iVar5 < 2) &&
       ((ulong)(((long)uStack_340 - (long)local_348 >> 3) * -0x3333333333333333) < 2)) {
      if ((byte)iVar5 == 1) {
        DomainId::DomainId((DomainId *)local_1b8,0xffffffff);
        iVar5 = (*this->mStorage->_vptr_PersistentStorage[5])(this->mStorage,local_3f0,local_1b8);
        cVar4 = (char)iVar5;
        SVar8 = kNotFound;
        if (cVar4 != '\x01') {
          SVar8 = (cVar4 != '\0') << 2;
        }
        bVar9 = cVar4 == '\0';
        if (bVar9) {
          local_3f0._0_4_ = local_1b8._0_4_;
        }
      }
      else {
        local_3f0._0_4_ = ((DomainId *)local_348)->mId;
        std::__cxx11::string::_M_assign((string *)&local_3e8);
        bVar9 = true;
      }
    }
    else {
      bVar9 = false;
    }
    std::
    vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ::~vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               *)local_348);
    if (!bVar9) goto LAB_001e2af8;
  }
  Network::Network((Network *)local_3a8);
  if ((aValue->mPresentFlags & 0x30) != 0) {
    if ((aValue->mPresentFlags & 0x20) == 0) {
      std::__cxx11::string::_M_assign((string *)&local_3a0);
    }
    else {
      local_380 = (undefined6)aValue->mExtendedPanId;
      uStack_37a = (undefined2)(aValue->mExtendedPanId >> 0x30);
    }
    local_348 = (undefined1  [8])0x0;
    uStack_340 = (pointer)0x0;
    local_338._vptr_BorderAgent = (_func_int **)0x0;
    iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x16])(this->mStorage,local_3a8);
    auVar2 = local_348;
    cVar3 = (char)iVar5;
    cVar4 = '\x01';
    if (cVar3 != '\x01') {
      cVar4 = (cVar3 != '\0') << 2;
    }
    if ((cVar4 == '\x04') ||
       (1 < (ulong)(((long)uStack_340 - (long)local_348 >> 5) * -0x5555555555555555))) {
LAB_001e2bbf:
      pcVar7 = (char *)__cxa_allocate_exception(1);
      *pcVar7 = cVar4;
      __cxa_throw(pcVar7,&Status::typeinfo,0);
    }
    if (cVar3 == '\x01') {
      NetworkId::NetworkId((NetworkId *)local_1b8,0xffffffff);
      if ((~aValue->mPresentFlags & 0x30) == 0) {
        std::__cxx11::string::_M_assign((string *)&local_3a0);
      }
      local_3a8._4_4_ = local_3f0._0_4_;
      local_380 = (undefined6)aValue->mExtendedPanId;
      uStack_37a = (undefined2)(aValue->mExtendedPanId >> 0x30);
      local_350 = (uint)(((uint)aValue->mState & 7) == 4);
      iVar5 = (*this->mStorage->_vptr_PersistentStorage[6])(this->mStorage,local_3a8,local_1b8);
      if ((char)iVar5 != '\0') {
        pcVar7 = (char *)__cxa_allocate_exception(1);
        *pcVar7 = ((char)iVar5 != '\x01') * '\x03' + '\x01';
        __cxa_throw(pcVar7,&Status::typeinfo,0);
      }
      local_3a8._0_4_ = local_1b8._0_4_;
    }
    else {
      local_3a8 = *(undefined1 (*) [8])local_348;
      std::__cxx11::string::_M_assign((string *)&local_3a0);
      uStack_378 = (undefined6)((ulong)*(undefined8 *)((long)((long)auVar2 + 0x28) + 6) >> 0x10);
      local_380 = (undefined6)*(uint64_t *)((long)auVar2 + 0x28);
      uStack_37a = (undefined2)(*(uint64_t *)((long)auVar2 + 0x28) >> 0x30);
      std::__cxx11::string::_M_assign((string *)&local_370);
      uVar1 = local_3f0._0_4_;
      local_350 = *(int *)((long)auVar2 + 0x58);
      if (((local_3a8._4_4_ != local_3f0._0_4_) ||
          (local_398 != (aValue->mNetworkName)._M_string_length)) ||
         ((local_398 != 0 &&
          (iVar5 = bcmp(local_3a0._M_p,(aValue->mNetworkName)._M_dataplus._M_p,local_398),
          iVar5 != 0)))) {
        local_3a8._4_4_ = uVar1;
        std::__cxx11::string::_M_assign((string *)&local_3a0);
        iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x12])(this->mStorage,local_3a8);
        if ((char)iVar5 != '\0') {
          cVar4 = ((char)iVar5 != '\x01') * '\x03' + '\x01';
          goto LAB_001e2bbf;
        }
      }
    }
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               *)local_348);
  }
  BorderRouterId::BorderRouterId((BorderRouterId *)local_1b8,0xffffffff);
  BorderRouter::BorderRouter
            ((BorderRouter *)local_348,(BorderRouterId *)local_1b8,(NetworkId *)local_3a8,aValue);
  if (uStack_340._4_4_ == 0xffffffff) {
    puVar6 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar6 = 4;
    __cxa_throw(puVar6,&Status::typeinfo,0);
  }
  BorderRouter::BorderRouter((BorderRouter *)local_1b8);
  std::__cxx11::string::_M_assign((string *)(local_1b8 + 0x18));
  local_118 = aValue->mExtendedPanId;
  local_38 = 0x21;
  local_3c8.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x17])();
  cVar3 = (char)iVar5;
  cVar4 = '\x01';
  if (cVar3 != '\x01') {
    cVar4 = (cVar3 != '\0') << 2;
  }
  if (cVar4 == '\x01') {
LAB_001e2a60:
    iVar5 = (*this->mStorage->_vptr_PersistentStorage[7])(this->mStorage,local_348,&uStack_340);
    cVar3 = (char)iVar5;
LAB_001e2a7a:
    cVar4 = '\x01';
    if (cVar3 != '\x01') {
      cVar4 = (cVar3 != '\0') << 2;
    }
  }
  else if (cVar4 == '\0') {
    if ((long)local_3c8.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_3c8.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x188) {
      uStack_340 = (pointer)CONCAT44(uStack_340._4_4_,
                                     ((local_3c8.
                                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mId).mId);
      iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x13])();
      cVar3 = (char)iVar5;
      goto LAB_001e2a7a;
    }
    if (cVar3 == '\x01') goto LAB_001e2a60;
  }
  if (cVar4 != '\0') {
    pcVar7 = (char *)__cxa_allocate_exception(1);
    *pcVar7 = cVar4;
    __cxa_throw(pcVar7,&Status::typeinfo,0);
  }
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&local_3c8);
  local_1b8._0_8_ = &PTR__BorderRouter_002e1c80;
  BorderAgent::~BorderAgent((BorderAgent *)(local_1b8 + 0x10));
  local_348 = (undefined1  [8])&PTR__BorderRouter_002e1c80;
  BorderAgent::~BorderAgent(&local_338);
  if (local_370._M_p != local_360) {
    operator_delete(local_370._M_p);
  }
  SVar8 = kSuccess;
  if (local_3a0._M_p != local_390) {
    operator_delete(local_3a0._M_p);
    SVar8 = kSuccess;
  }
LAB_001e2af8:
  if (local_3e8._M_p != local_3d8) {
    operator_delete(local_3e8._M_p);
  }
  return SVar8;
}

Assistant:

Registry::Status Registry::Add(BorderAgent const &aValue)
{
    Domain           dom{};
    bool             domainCreated = false;
    Registry::Status status;

    if ((aValue.mPresentFlags & BorderAgent::kDomainNameBit) != 0)
    {
        dom.mName = aValue.mDomainName;
        std::vector<Domain> domains;
        status = MapStatus(mStorage->Lookup(dom, domains));
        if (status == Registry::Status::kError || domains.size() > 1)
        {
            return Registry::Status::kError;
        }

        if (status == Registry::Status::kNotFound)
        {
            DomainId domainId{EMPTY_ID};
            status = MapStatus(mStorage->Add(dom, domainId));
            if (status != Registry::Status::kSuccess)
            {
                return status;
            }
            dom.mId       = domainId;
            domainCreated = true;
        }
        else
        {
            dom = domains[0];
        }
    }

    Network nwk{};
    bool    networkCreated = false;

    try
    {
        if ((aValue.mPresentFlags & BorderAgent::kNetworkNameBit) != 0 ||
            (aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0)
        {
            // If xpan present lookup with it only
            // Discussed: is different aName an error?
            // Decided: update network aName in the network entity
            if ((aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0)
            {
                nwk.mXpan = aValue.mExtendedPanId;
            }
            else
            {
                nwk.mName = aValue.mNetworkName;
            }

            std::vector<Network> nwks;
            status = MapStatus(mStorage->Lookup(nwk, nwks));
            if (status == Registry::Status::kError || nwks.size() > 1)
            {
                throw status;
            }

            if (status == Registry::Status::kNotFound)
            {
                NetworkId networkId{EMPTY_ID};
                // It is possible we found the network by xpan
                if ((aValue.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0 &&
                    (aValue.mPresentFlags & BorderAgent::kNetworkNameBit) != 0)
                {
                    nwk.mName = aValue.mNetworkName;
                }
                nwk.mDomainId = dom.mId;
                nwk.mXpan     = aValue.mExtendedPanId;

                // Provisionally set network's CCM flag considering
                // advertised Connection Mode.
                //
                // Please note that actually see if CCM enabled or not
                // is possible only by respective security policy flag
                // from Active Operational Dataset. Later, if and when
                // successfully petitioned to the network, the flag
                // will be updated by real network dataset.
                nwk.mCcm = ((aValue.mState.mConnectionMode == 4) ? 1 : 0);
                status   = MapStatus(mStorage->Add(nwk, networkId));
                if (status != Registry::Status::kSuccess)
                {
                    throw status;
                }
                nwk.mId        = networkId;
                networkCreated = true;
            }
            else
            {
                nwk = nwks[0];
                if (nwk.mDomainId.mId != dom.mId.mId || nwk.mName != aValue.mNetworkName)
                {
                    nwk.mDomainId.mId = dom.mId.mId;
                    nwk.mName         = aValue.mNetworkName;
                    status            = MapStatus(mStorage->Update(nwk));
                    if (status != Registry::Status::kSuccess)
                    {
                        throw status;
                    }
                }
            }
        }

        BorderRouter br{BorderRouterId{EMPTY_ID}, nwk.mId, aValue};
        try
        {
            if (br.mNetworkId.mId == EMPTY_ID)
            {
                throw Registry::Status::kError;
            }

            // Lookup BorderRouter by address and port to decide to add() or update()
            // Assuming address and port are set (it should be so).
            BorderRouter lookupBr{};
            lookupBr.mAgent.mAddr          = aValue.mAddr;
            lookupBr.mAgent.mExtendedPanId = aValue.mExtendedPanId;
            lookupBr.mAgent.mPresentFlags  = BorderAgent::kAddrBit | BorderAgent::kExtendedPanIdBit;
            std::vector<BorderRouter> routers;
            status = MapStatus(mStorage->Lookup(lookupBr, routers));
            if (status == Registry::Status::kSuccess && routers.size() == 1)
            {
                br.mId.mId = routers[0].mId.mId;
                status     = MapStatus(mStorage->Update(br));
            }
            else if (status == Registry::Status::kNotFound)
            {
                status = MapStatus(mStorage->Add(br, br.mId));
            }

            if (status != Registry::Status::kSuccess)
            {
                throw status;
            }
        } catch (Registry::Status thrownStatus)
        {
            if (networkCreated)
            {
                MapStatus(mStorage->Del(nwk.mId));
            }
            throw;
        }
    } catch (Registry::Status thrownStatus)
    {
        if (domainCreated)
        {
            MapStatus(mStorage->Del(dom.mId));
        }
        status = thrownStatus;
    }
    return status;
}